

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeBoolConstant(Builder *this,bool b,bool specConstant)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  iterator __position;
  Id IVar4;
  Op OVar5;
  Id IVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  Op OVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  Instruction *c;
  Instruction *local_30;
  _Head_base<0UL,_spv::Instruction_*,_false> local_28;
  
  IVar4 = makeBoolType(this);
  OVar8 = (Op)CONCAT71(in_register_00000031,b);
  OVar5 = OpConstantFalse - OVar8;
  OVar8 = OVar8 ^ OpSpecConstantFalse;
  if ((int)CONCAT71(in_register_00000011,specConstant) == 0) {
    ppIVar2 = this->groupedConstants[0x14].
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (uint)((ulong)((long)this->groupedConstants[0x14].
                                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
    if ((int)uVar7 < 1) {
      IVar6 = 0;
    }
    else {
      uVar9 = 0;
      IVar6 = 0;
      do {
        pIVar3 = ppIVar2[uVar9];
        if ((pIVar3->typeId == IVar4) && (pIVar3->opCode == OVar5)) {
          IVar6 = pIVar3->resultId;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar9);
    }
    OVar8 = OVar5;
    if (IVar6 != 0) {
      return IVar6;
    }
  }
  local_30 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar6 = this->uniqueId + 1;
  this->uniqueId = IVar6;
  local_30->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
  local_30->resultId = IVar6;
  local_30->typeId = IVar4;
  local_30->opCode = OVar8;
  (local_30->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_30->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_30->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30->block = (Block *)0x0;
  local_28._M_head_impl = local_30;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_28);
  if (local_28._M_head_impl != (Instruction *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Instruction[1])();
  }
  __position._M_current =
       this->groupedConstants[0x14].
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      this->groupedConstants[0x14].
      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>
              ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
               (this->groupedConstants + 0x14),__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppIVar1 = &this->groupedConstants[0x14].
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  Module::mapInstruction(&this->module,local_30);
  return local_30->resultId;
}

Assistant:

Id Builder::makeBoolConstant(bool b, bool specConstant)
{
    Id typeId = makeBoolType();
    Instruction* constant;
    Op opcode = specConstant ? (b ? OpSpecConstantTrue : OpSpecConstantFalse) : (b ? OpConstantTrue : OpConstantFalse);

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = 0;
        for (int i = 0; i < (int)groupedConstants[OpTypeBool].size(); ++i) {
            constant = groupedConstants[OpTypeBool][i];
            if (constant->getTypeId() == typeId && constant->getOpCode() == opcode)
                existing = constant->getResultId();
        }

        if (existing)
            return existing;
    }

    // Make it
    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeBool].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}